

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64 max_mem)

{
  Regexp *this;
  bool bVar1;
  bool bVar2;
  Frag FVar3;
  Frag FVar4;
  Prog *pPVar5;
  bool bVar6;
  Regexp *sre;
  Compiler c;
  
  Compiler(&c);
  Setup(&c,(uint)re->parse_flags_,max_mem,ANCHOR_BOTH);
  c.reversed_ = reversed;
  sre = Regexp::Simplify(re);
  if (sre != (Regexp *)0x0) {
    bVar1 = IsAnchorStart(&sre,0);
    bVar2 = IsAnchorEnd(&sre,0);
    this = sre;
    FVar3 = Regexp::Walker<re2::Frag>::WalkExponential
                      (&c.super_Walker<re2::Frag>,sre,(Frag)0x0,c.max_inst_ * 2);
    Regexp::Decref(this);
    if (c.failed_ == false) {
      c.reversed_ = false;
      FVar4 = Match(&c,0);
      FVar3 = Cat(&c,FVar3,FVar4);
      bVar6 = bVar2;
      if (reversed) {
        bVar6 = bVar1;
        bVar1 = bVar2;
      }
      (c.prog_)->start_ = FVar3.begin;
      (c.prog_)->anchor_start_ = bVar1;
      (c.prog_)->anchor_end_ = bVar6;
      if (bVar1 == false) {
        FVar4 = DotStar(&c);
        FVar3 = Cat(&c,FVar4,FVar3);
      }
      (c.prog_)->start_unanchored_ = FVar3.begin;
      (c.prog_)->reversed_ = reversed;
      pPVar5 = Finish(&c);
      goto LAB_001291e3;
    }
  }
  pPVar5 = (Prog *)0x0;
LAB_001291e3:
  ~Compiler(&c);
  return pPVar5;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64 max_mem) {
  Compiler c;

  c.Setup(re->parse_flags(), max_mem, RE2::ANCHOR_BOTH /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag f = c.WalkExponential(sre, Frag(), 2*c.max_inst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  Frag all = c.Cat(f, c.Match(0));
  c.prog_->set_start(all.begin);

  if (reversed) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  // Also create unanchored version, which starts with a .*? loop.
  if (c.prog_->anchor_start()) {
    c.prog_->set_start_unanchored(c.prog_->start());
  } else {
    Frag unanchored = c.Cat(c.DotStar(), all);
    c.prog_->set_start_unanchored(unanchored.begin);
  }

  c.prog_->set_reversed(reversed);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}